

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

int cmsys::regmatch(char *prog)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  byte bVar7;
  byte *prog_00;
  char *pcVar8;
  byte bVar9;
  long lVar10;
  size_t sVar11;
  byte *pbVar12;
  byte *__s2;
  
  pbVar12 = regbol;
  __s2 = reginput;
  if (prog != (char *)0x0) {
    do {
      pbVar1 = reginput;
      if ((prog == &regdummy) ||
         (uVar3 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
         uVar3 == 0)) {
        prog_00 = (byte *)0x0;
LAB_003ec968:
        bVar9 = *prog;
      }
      else {
        bVar9 = *prog;
        if (bVar9 == 7) {
          prog_00 = (byte *)prog + -(ulong)uVar3;
          goto LAB_003ec968;
        }
        prog_00 = (byte *)prog + uVar3;
      }
      if (0x27 < bVar9) {
switchD_003ec985_caseD_c:
        pcVar8 = "RegularExpression::find(): Internal error -- memory corrupted.";
        goto LAB_003eca6f;
      }
      uVar6 = (ulong)bVar9;
      switch(uVar6) {
      case 0:
        return 1;
      case 1:
        if (__s2 != pbVar12) {
          return 0;
        }
        break;
      case 2:
        if (*__s2 != 0) {
          return 0;
        }
        break;
      case 3:
        if (*__s2 == 0) {
          return 0;
        }
        __s2 = __s2 + 1;
        reginput = __s2;
        break;
      case 4:
        if ((char)*__s2 == 0) {
          return 0;
        }
        pcVar8 = strchr((char *)((byte *)prog + 3),(int)(char)*__s2);
        if (pcVar8 == (char *)0x0) {
          return 0;
        }
        goto LAB_003eca44;
      case 5:
        if ((char)*__s2 == 0) {
          return 0;
        }
        pcVar8 = strchr((char *)((byte *)prog + 3),(int)(char)*__s2);
        if (pcVar8 != (char *)0x0) {
          return 0;
        }
LAB_003eca44:
        __s2 = __s2 + 1;
        reginput = __s2;
        break;
      case 6:
        if (*prog_00 == 6) {
          do {
            reginput = pbVar1;
            iVar4 = regmatch((char *)((byte *)prog + 3));
            if (iVar4 != 0) {
              return 1;
            }
            if (prog == &regdummy) {
              reginput = pbVar1;
              return 0;
            }
            uVar3 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8;
            if (uVar3 == 0) {
              reginput = pbVar1;
              return 0;
            }
            uVar6 = -(ulong)uVar3;
            if (*prog != 7) {
              uVar6 = (ulong)uVar3;
            }
            pbVar12 = (byte *)prog + uVar6;
            prog = (char *)((byte *)prog + uVar6);
          } while (*pbVar12 == 6);
          reginput = pbVar1;
          return 0;
        }
        prog_00 = (byte *)prog + 3;
        break;
      case 7:
      case 9:
        break;
      case 8:
        if (((byte *)prog)[3] != *__s2) {
          return 0;
        }
        sVar5 = strlen((char *)((byte *)prog + 3));
        if ((1 < sVar5) &&
           (iVar4 = strncmp((char *)((byte *)prog + 3),(char *)__s2,sVar5), iVar4 != 0)) {
          return 0;
        }
        __s2 = __s2 + sVar5;
        reginput = __s2;
        break;
      case 10:
      case 0xb:
        bVar7 = 0;
        if (*prog_00 == 8) {
          bVar7 = prog_00[3];
        }
        if (5 < ((byte *)prog)[3] - 3) {
switchD_003ecb2c_caseD_6:
          puts("cm RegularExpression::find(): Internal error.");
          iVar4 = 0;
          goto LAB_003ecc3f;
        }
        pbVar12 = (byte *)prog + 6;
        switch((uint)((byte *)prog)[3]) {
        case 3:
          sVar11 = strlen((char *)reginput);
          reginput = pbVar1 + (int)sVar11;
          goto LAB_003ecc38;
        case 4:
          bVar2 = *reginput;
          if (bVar2 != 0) {
            sVar11 = 0;
            goto LAB_003ecbf0;
          }
          break;
        case 5:
          bVar2 = *reginput;
          if (bVar2 != 0) {
            sVar11 = 0;
            goto LAB_003ecbc6;
          }
          break;
        default:
          goto switchD_003ecb2c_caseD_6;
        case 8:
          if (*pbVar12 != *reginput) break;
          sVar5 = 0;
          do {
            sVar11 = sVar5 + 1;
            lVar10 = sVar5 + 1;
            sVar5 = sVar11;
          } while (*pbVar12 == reginput[lVar10]);
          reginput = reginput + sVar11;
          goto LAB_003ecc38;
        }
        sVar11 = 0;
        goto LAB_003ecc38;
      default:
        goto switchD_003ec985_caseD_c;
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        iVar4 = regmatch((char *)prog_00);
        if (iVar4 == 0) {
          return 0;
        }
        if (*(long *)(regstartp + -0xa0 + uVar6 * 8) == 0) {
          *(byte **)(regstartp + -0xa0 + uVar6 * 8) = pbVar1;
          return 1;
        }
        return 1;
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        iVar4 = regmatch((char *)prog_00);
        if (iVar4 == 0) {
          return 0;
        }
        if (*(long *)(regendp + -0xf0 + uVar6 * 8) == 0) {
          *(byte **)(regendp + -0xf0 + uVar6 * 8) = pbVar1;
          return 1;
        }
        return 1;
      }
      prog = (char *)prog_00;
    } while (prog_00 != (byte *)0x0);
  }
  pcVar8 = "RegularExpression::find(): Internal error -- corrupted pointers.";
LAB_003eca6f:
  puts(pcVar8);
  return 0;
  while( true ) {
    bVar2 = pbVar1[sVar11 + 1];
    sVar11 = sVar11 + 1;
    if (bVar2 == 0) break;
LAB_003ecbc6:
    pcVar8 = strchr((char *)pbVar12,(int)(char)bVar2);
    if (pcVar8 != (char *)0x0) break;
  }
  goto LAB_003ecc0c;
  while( true ) {
    bVar2 = pbVar1[sVar11 + 1];
    sVar11 = sVar11 + 1;
    if (bVar2 == 0) break;
LAB_003ecbf0:
    pcVar8 = strchr((char *)pbVar12,(int)(char)bVar2);
    if (pcVar8 == (char *)0x0) break;
  }
LAB_003ecc0c:
  reginput = pbVar1 + sVar11;
LAB_003ecc38:
  iVar4 = (int)sVar11;
LAB_003ecc3f:
  if (iVar4 < (int)(uint)(bVar9 != 10)) {
    return 0;
  }
  lVar10 = (long)iVar4 + 1;
  while (((bVar7 != 0 && (bVar7 != *reginput)) || (iVar4 = regmatch((char *)prog_00), iVar4 == 0)))
  {
    reginput = pbVar1 + lVar10 + -2;
    lVar10 = lVar10 + -1;
    if (lVar10 <= (long)(ulong)(bVar9 != 10)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int regmatch (const char* prog) {
    const char* scan;  // Current node.
    const char* next;  // Next node.

    scan = prog;

    while (scan != 0) {

        next = regnext(scan);

        switch (OP(scan)) {
            case BOL:
                if (reginput != regbol)
                    return (0);
                break;
            case EOL:
                if (*reginput != '\0')
                    return (0);
                break;
            case ANY:
                if (*reginput == '\0')
                    return (0);
                reginput++;
                break;
            case EXACTLY:{
                    size_t len;
                    const char* opnd;

                    opnd = OPERAND(scan);
                    // Inline the first character, for speed.
                    if (*opnd != *reginput)
                        return (0);
                    len = strlen(opnd);
                    if (len > 1 && strncmp(opnd, reginput, len) != 0)
                        return (0);
                    reginput += len;
                }
                break;
            case ANYOF:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) == 0)
                    return (0);
                reginput++;
                break;
            case ANYBUT:
                if (*reginput == '\0' || strchr(OPERAND(scan), *reginput) != 0)
                    return (0);
                reginput++;
                break;
            case NOTHING:
                break;
            case BACK:
                break;
            case OPEN + 1:
            case OPEN + 2:
            case OPEN + 3:
            case OPEN + 4:
            case OPEN + 5:
            case OPEN + 6:
            case OPEN + 7:
            case OPEN + 8:
            case OPEN + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - OPEN;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set startp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regstartp[no] == 0)
                            regstartp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case CLOSE + 1:
            case CLOSE + 2:
            case CLOSE + 3:
            case CLOSE + 4:
            case CLOSE + 5:
            case CLOSE + 6:
            case CLOSE + 7:
            case CLOSE + 8:
            case CLOSE + 9:{
                    int    no;
                    const char* save;

                    no = OP(scan) - CLOSE;
                    save = reginput;

                    if (regmatch(next)) {

                        //
                        // Don't set endp if some later invocation of the
                        // same parentheses already has.
                        //
                        if (regendp[no] == 0)
                            regendp[no] = save;
                        return (1);
                    }
                    else
                        return (0);
                }
//              break;
            case BRANCH:{

              const char* save;

                    if (OP(next) != BRANCH)     // No choice.
                        next = OPERAND(scan);   // Avoid recursion.
                    else {
                        do {
                            save = reginput;
                            if (regmatch(OPERAND(scan)))
                                return (1);
                            reginput = save;
                            scan = regnext(scan);
                        } while (scan != 0 && OP(scan) == BRANCH);
                        return (0);
                        // NOTREACHED
                    }
                }
                break;
            case STAR:
            case PLUS:{
                    char   nextch;
                    int        no;
                    const char* save;
                    int        min_no;

                    //
                    // Lookahead to avoid useless match attempts when we know
                    // what character comes next.
                    //
                    nextch = '\0';
                    if (OP(next) == EXACTLY)
                        nextch = *OPERAND(next);
                    min_no = (OP(scan) == STAR) ? 0 : 1;
                    save = reginput;
                    no = regrepeat(OPERAND(scan));
                    while (no >= min_no) {
                        // If it could work, try it.
                        if (nextch == '\0' || *reginput == nextch)
                            if (regmatch(next))
                                return (1);
                        // Couldn't or didn't -- back up.
                        no--;
                        reginput = save + no;
                    }
                    return (0);
                }
//              break;
            case END:
                return (1);     // Success!

            default:
                //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
                printf ("RegularExpression::find(): Internal error -- memory corrupted.\n");
                return 0;
        }
        scan = next;
    }

    //
    //  We get here only if there's trouble -- normally "case END" is the
    //  terminating point.
    //
    //RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
    printf ("RegularExpression::find(): Internal error -- corrupted pointers.\n");
    return (0);
}